

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addr.h
# Opt level: O2

void __thiscall
mocker::nasm::MemoryAddr::MemoryAddr(MemoryAddr *this,shared_ptr<mocker::nasm::Addr> *reg1)

{
  (this->super_EffectiveAddr).super_Addr._vptr_Addr = (_func_int **)&PTR__MemoryAddr_001f0118;
  std::static_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>
            ((shared_ptr<mocker::nasm::Addr> *)&this->reg1);
  this->number = 0;
  (this->reg2).super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->reg2).super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->scale = 0;
  return;
}

Assistant:

explicit MemoryAddr(const std::shared_ptr<Addr> &reg1)
      : reg1(std::static_pointer_cast<Register>(reg1)) {}